

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int linux_kqueue_start_thread(void)

{
  int iVar1;
  int iVar2;
  
  pthread_mutex_lock((pthread_mutex_t *)&monitoring_thread_mtx);
  iVar1 = pthread_create(&monitoring_thread,(pthread_attr_t *)0x0,monitoring_thread_loop,(void *)0x0
                        );
  iVar2 = -1;
  if (iVar1 == 0) {
    pthread_cond_wait((pthread_cond_t *)&monitoring_thread_cond,
                      (pthread_mutex_t *)&monitoring_thread_mtx);
    iVar2 = 0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&monitoring_thread_mtx);
  return iVar2;
}

Assistant:

static int
linux_kqueue_start_thread(void)
{
    pthread_mutex_lock(&monitoring_thread_mtx);
    if (pthread_create(&monitoring_thread, NULL, monitoring_thread_loop, NULL)) {
         dbg_perror("linux_kqueue_start_thread failure");
         pthread_mutex_unlock(&monitoring_thread_mtx);

         return (-1);
    }
    /* Wait for thread creating to be done as we need monitoring_tid to be available */
    pthread_cond_wait(&monitoring_thread_cond, &monitoring_thread_mtx); /* unlocks mt_mtx allowing child to lock it */
    pthread_mutex_unlock(&monitoring_thread_mtx);

    return (0);
}